

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<float> * __thiscall
Fad<float>::operator+=
          (Fad<float> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> *x)

{
  uint uVar1;
  float *pfVar2;
  bool bVar3;
  uint ssize;
  ulong uVar4;
  int i;
  ulong uVar5;
  value_type vVar6;
  
  ssize = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::size
                    (&x->fadexpr_);
  if (ssize != 0) {
    uVar1 = (this->dx_).num_elts;
    if (uVar1 == 0) {
      Vector<float>::resize(&this->dx_,ssize);
      pfVar2 = (this->dx_).ptr_to_data;
      bVar3 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::
              hasFastAccess(&x->fadexpr_);
      uVar4 = 0;
      if (0 < (int)ssize) {
        uVar4 = (ulong)ssize;
      }
      uVar5 = 0;
      if (bVar3) {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::
                  fastAccessDx(&x->fadexpr_,(int)uVar5);
          pfVar2[uVar5] = vVar6;
        }
      }
      else {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                            (&x->fadexpr_,(int)uVar5);
          pfVar2[uVar5] = vVar6;
        }
      }
    }
    else {
      pfVar2 = (this->dx_).ptr_to_data;
      bVar3 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::
              hasFastAccess(&x->fadexpr_);
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar5 = 0;
      if (bVar3) {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::
                  fastAccessDx(&x->fadexpr_,(int)uVar5);
          pfVar2[uVar5] = vVar6 + pfVar2[uVar5];
        }
      }
      else {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::dx
                            (&x->fadexpr_,(int)uVar5);
          pfVar2[uVar5] = vVar6 + pfVar2[uVar5];
        }
      }
    }
  }
  vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>::val
                    (&x->fadexpr_);
  this->val_ = vVar6 + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}